

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

bool idx2::operator==(stref *Lhs,stref *Rhs)

{
  int local_4c;
  int I;
  stref *RhsR;
  stref *LhsR;
  stref *Rhs_local;
  stref *Lhs_local;
  
  if (Lhs->Size == Rhs->Size) {
    for (local_4c = 0; local_4c < Lhs->Size; local_4c = local_4c + 1) {
      if (Lhs->Size <= local_4c) {
        __assert_fail("Idx < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                      ,0x9b,"char &idx2::stref::operator[](int) const");
      }
      if (Rhs->Size <= local_4c) {
        __assert_fail("Idx < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                      ,0x9b,"char &idx2::stref::operator[](int) const");
      }
      if ((Lhs->field_0).Ptr[local_4c] != (Rhs->field_0).Ptr[local_4c]) {
        return false;
      }
    }
    Lhs_local._3_1_ = true;
  }
  else {
    Lhs_local._3_1_ = false;
  }
  return Lhs_local._3_1_;
}

Assistant:

bool
operator==(const stref& Lhs, const stref& Rhs)
{
  stref& LhsR = const_cast<stref&>(Lhs);
  stref& RhsR = const_cast<stref&>(Rhs);
  if (LhsR.Size != RhsR.Size)
    return false;
  for (int I = 0; I < LhsR.Size; ++I)
  {
    if (LhsR[I] != RhsR[I])
      return false;
  }
  return true;
}